

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O2

void highsReportLogOptions(HighsLogOptions *log_options_)

{
  char *__s;
  string local_38;
  
  puts("\nHighs log options");
  __s = "   log_stream = Not NULL";
  if (log_options_->log_stream == (FILE *)0x0) {
    __s = "   log_stream = NULL";
  }
  puts(__s);
  highsBoolToString_abi_cxx11_(&local_38,*log_options_->output_flag,2);
  printf("   output_flag = %s\n",local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  highsBoolToString_abi_cxx11_(&local_38,*log_options_->log_to_console,2);
  printf("   log_to_console = %s\n",local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  printf("   log_dev_level = %d\n\n",(ulong)(uint)*log_options_->log_dev_level);
  return;
}

Assistant:

void highsReportLogOptions(const HighsLogOptions& log_options_) {
  printf("\nHighs log options\n");
  if (log_options_.log_stream == NULL) {
    printf("   log_stream = NULL\n");
  } else {
    printf("   log_stream = Not NULL\n");
  }
  printf("   output_flag = %s\n",
         highsBoolToString(*log_options_.output_flag).c_str());
  printf("   log_to_console = %s\n",
         highsBoolToString(*log_options_.log_to_console).c_str());
  printf("   log_dev_level = %" HIGHSINT_FORMAT "\n\n",
         *log_options_.log_dev_level);
}